

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_set_bit(mbedtls_mpi *X,size_t pos,uchar val)

{
  mbedtls_mpi *X_00;
  ulong nblimbs;
  byte in_DL;
  ulong in_RSI;
  long *in_RDI;
  size_t idx;
  size_t off;
  int ret;
  int local_20;
  
  local_20 = 0;
  X_00 = (mbedtls_mpi *)(in_RSI >> 6);
  nblimbs = in_RSI & 0x3f;
  if ((in_DL != 0) && (in_DL != 1)) {
    return -4;
  }
  if ((ulong)*(ushort *)((long)in_RDI + 10) << 6 <= in_RSI) {
    if (in_DL == 0) {
      return 0;
    }
    local_20 = mbedtls_mpi_grow(X_00,nblimbs);
    if (local_20 != 0) {
      return local_20;
    }
  }
  *(ulong *)(*in_RDI + (long)X_00 * 8) =
       (1L << ((byte)nblimbs & 0x3f) ^ 0xffffffffffffffffU) & *(ulong *)(*in_RDI + (long)X_00 * 8);
  *(ulong *)(*in_RDI + (long)X_00 * 8) =
       (ulong)in_DL << ((byte)nblimbs & 0x3f) | *(ulong *)(*in_RDI + (long)X_00 * 8);
  return local_20;
}

Assistant:

int mbedtls_mpi_set_bit(mbedtls_mpi *X, size_t pos, unsigned char val)
{
    int ret = 0;
    size_t off = pos / biL;
    size_t idx = pos % biL;

    if (val != 0 && val != 1) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (X->n * biL <= pos) {
        if (val == 0) {
            return 0;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, off + 1));
    }

    X->p[off] &= ~((mbedtls_mpi_uint) 0x01 << idx);
    X->p[off] |= (mbedtls_mpi_uint) val << idx;

cleanup:

    return ret;
}